

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_frame_flags_t get_frame_pkt_flags(AV1_COMP *cpi,uint lib_flags)

{
  aom_codec_frame_flags_t flags;
  uint lib_flags_local;
  AV1_COMP *cpi_local;
  
  flags = lib_flags << 0x10;
  if ((lib_flags & 1) != 0) {
    flags = flags | 1;
  }
  if ((lib_flags & 0x10) != 0) {
    flags = flags | 0x10;
  }
  if ((lib_flags & 0x20) != 0) {
    flags = flags | 0x20;
  }
  if ((lib_flags & 0x40) != 0) {
    flags = flags | 0x40;
  }
  if (cpi->droppable != 0) {
    flags = flags | 2;
  }
  return flags;
}

Assistant:

static aom_codec_frame_flags_t get_frame_pkt_flags(const AV1_COMP *cpi,
                                                   unsigned int lib_flags) {
  aom_codec_frame_flags_t flags = lib_flags << 16;
  if (lib_flags & FRAMEFLAGS_KEY) flags |= AOM_FRAME_IS_KEY;
  if (lib_flags & FRAMEFLAGS_INTRAONLY) flags |= AOM_FRAME_IS_INTRAONLY;
  if (lib_flags & FRAMEFLAGS_SWITCH) flags |= AOM_FRAME_IS_SWITCH;
  if (lib_flags & FRAMEFLAGS_ERROR_RESILIENT)
    flags |= AOM_FRAME_IS_ERROR_RESILIENT;
  if (cpi->droppable) flags |= AOM_FRAME_IS_DROPPABLE;

  return flags;
}